

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlwriter.c
# Opt level: O3

int xmlTextWriterStartElement(xmlTextWriterPtr writer,xmlChar *name)

{
  int iVar1;
  int iVar2;
  int iVar3;
  xmlLinkPtr lk;
  void *pvVar4;
  undefined8 *data;
  xmlChar *pxVar5;
  int iVar6;
  
  iVar6 = -1;
  if (name == (xmlChar *)0x0 || writer == (xmlTextWriterPtr)0x0) {
    return -1;
  }
  if (*name == '\0') {
    return -1;
  }
  lk = xmlListFront(writer->nodes);
  iVar3 = 0;
  if ((lk != (xmlLinkPtr)0x0) && (pvVar4 = xmlLinkGetData(lk), iVar3 = 0, pvVar4 != (void *)0x0)) {
    iVar2 = *(int *)((long)pvVar4 + 8);
    if (iVar2 - 4U < 2) {
      return -1;
    }
    iVar1 = 0;
    iVar3 = 0;
    if (iVar2 != 1) {
      if (iVar2 != 2) goto LAB_001b3217;
      iVar1 = xmlTextWriterEndAttribute(writer);
      if (iVar1 < 0) {
        return -1;
      }
    }
    iVar2 = xmlTextWriterOutputNSDecl(writer);
    if (iVar2 < 0) {
      return -1;
    }
    iVar3 = xmlOutputBufferWriteString(writer->out,">");
    if (iVar3 < 0) {
      return -1;
    }
    if (writer->indent != 0) {
      xmlOutputBufferWriteString(writer->out,"\n");
    }
    iVar3 = iVar2 + iVar1 + iVar3;
    *(undefined4 *)((long)pvVar4 + 8) = 3;
  }
LAB_001b3217:
  data = (undefined8 *)(*xmlMalloc)(0x10);
  if (data == (undefined8 *)0x0) {
    xmlWriterErrMsg(writer,XML_ERR_NO_MEMORY,"xmlTextWriterStartElement : out of memory!\n");
  }
  else {
    pxVar5 = xmlStrdup(name);
    *data = pxVar5;
    if (pxVar5 == (xmlChar *)0x0) {
      xmlWriterErrMsg(writer,XML_ERR_NO_MEMORY,"xmlTextWriterStartElement : out of memory!\n");
      (*xmlFree)(data);
    }
    else {
      *(undefined4 *)(data + 1) = 1;
      xmlListPushFront(writer->nodes,data);
      if (writer->indent != 0) {
        iVar2 = xmlTextWriterWriteIndent(writer);
        iVar3 = iVar3 + iVar2;
      }
      iVar2 = xmlOutputBufferWriteString(writer->out,"<");
      if ((-1 < iVar2) &&
         (iVar1 = xmlOutputBufferWriteString(writer->out,(char *)*data), -1 < iVar1)) {
        iVar6 = iVar2 + iVar3 + iVar1;
      }
    }
  }
  return iVar6;
}

Assistant:

int
xmlTextWriterStartElement(xmlTextWriterPtr writer, const xmlChar * name)
{
    int count;
    int sum;
    xmlLinkPtr lk;
    xmlTextWriterStackEntry *p;

    if ((writer == NULL) || (name == NULL) || (*name == '\0'))
        return -1;

    sum = 0;
    lk = xmlListFront(writer->nodes);
    if (lk != 0) {
        p = (xmlTextWriterStackEntry *) xmlLinkGetData(lk);
        if (p != 0) {
            switch (p->state) {
                case XML_TEXTWRITER_PI:
                case XML_TEXTWRITER_PI_TEXT:
                    return -1;
                case XML_TEXTWRITER_NONE:
                    break;
				case XML_TEXTWRITER_ATTRIBUTE:
					count = xmlTextWriterEndAttribute(writer);
					if (count < 0)
						return -1;
					sum += count;
					/* fallthrough */
                case XML_TEXTWRITER_NAME:
                    /* Output namespace declarations */
                    count = xmlTextWriterOutputNSDecl(writer);
                    if (count < 0)
                        return -1;
                    sum += count;
                    count = xmlOutputBufferWriteString(writer->out, ">");
                    if (count < 0)
                        return -1;
                    sum += count;
                    if (writer->indent)
                        count =
                            xmlOutputBufferWriteString(writer->out, "\n");
                    p->state = XML_TEXTWRITER_TEXT;
                    break;
                default:
                    break;
            }
        }
    }

    p = (xmlTextWriterStackEntry *)
        xmlMalloc(sizeof(xmlTextWriterStackEntry));
    if (p == 0) {
        xmlWriterErrMsg(writer, XML_ERR_NO_MEMORY,
                        "xmlTextWriterStartElement : out of memory!\n");
        return -1;
    }

    p->name = xmlStrdup(name);
    if (p->name == 0) {
        xmlWriterErrMsg(writer, XML_ERR_NO_MEMORY,
                        "xmlTextWriterStartElement : out of memory!\n");
        xmlFree(p);
        return -1;
    }
    p->state = XML_TEXTWRITER_NAME;

    xmlListPushFront(writer->nodes, p);

    if (writer->indent) {
        count = xmlTextWriterWriteIndent(writer);
        sum += count;
    }

    count = xmlOutputBufferWriteString(writer->out, "<");
    if (count < 0)
        return -1;
    sum += count;
    count =
        xmlOutputBufferWriteString(writer->out, (const char *) p->name);
    if (count < 0)
        return -1;
    sum += count;

    return sum;
}